

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderLoopTests.cpp
# Opt level: O1

int __thiscall deqp::gles2::Functional::ShaderLoopCase::init(ShaderLoopCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  _func_int **pp_Var2;
  
  if (this->m_requirement == LOOPREQUIREMENT_DYNAMIC) {
    pp_Var2 = ((this->super_ShaderRenderCase).m_ctxInfo)->_vptr_ContextInfo;
    if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
      pp_Var2 = pp_Var2 + 6;
    }
    else {
      pp_Var2 = pp_Var2 + 9;
    }
  }
  else {
    if (this->m_requirement != LOOPREQUIREMENT_UNIFORM) goto LAB_00eff532;
    pp_Var2 = ((this->super_ShaderRenderCase).m_ctxInfo)->_vptr_ContextInfo;
    if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
      pp_Var2 = pp_Var2 + 5;
    }
    else {
      pp_Var2 = pp_Var2 + 8;
    }
  }
  (**pp_Var2)();
LAB_00eff532:
  iVar1 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  return iVar1;
}

Assistant:

void ShaderLoopCase::init (void)
{
	bool isSupported = true;

	if (m_requirement == LOOPREQUIREMENT_UNIFORM)
		isSupported = m_isVertexCase ? m_ctxInfo.isVertexUniformLoopSupported()
									 : m_ctxInfo.isFragmentUniformLoopSupported();
	else if (m_requirement == LOOPREQUIREMENT_DYNAMIC)
		isSupported = m_isVertexCase ? m_ctxInfo.isVertexDynamicLoopSupported()
									 : m_ctxInfo.isFragmentDynamicLoopSupported();

	try
	{
		ShaderRenderCase::init();
	}
	catch (const CompileFailed&)
	{
		if (!isSupported)
			throw tcu::NotSupportedError("Loop type is not supported");
		else
			throw;
	}
}